

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backtrace.cpp
# Opt level: O1

string * sh(string *__return_storage_ptr__,string *cmd)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  runtime_error *this;
  shared_ptr<_IO_FILE> pipe;
  array<char,_128UL> buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  char local_a0 [128];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __stream = popen((cmd->_M_dataplus)._M_p,"r");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<_IO_FILE*,int(*)(_IO_FILE*),std::allocator<void>,void>(&local_a8,__stream,pclose);
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      do {
        pcVar2 = fgets(local_a0,0x80,__stream);
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        iVar1 = feof(__stream);
      } while (iVar1 == 0);
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"popen() failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string sh(string cmd) {
    array<char, 128> buffer;
    string result;
    shared_ptr<FILE> pipe(popen(cmd.c_str(), "r"), pclose);
    if (!pipe) throw runtime_error("popen() failed!");
    while (!feof(pipe.get())) {
        if (fgets(buffer.data(), 128, pipe.get()) != nullptr) {
            result += buffer.data();
        }
    }
    return result;
}